

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O0

size_t CBB_get_utf8_len(uint32_t u)

{
  size_t sStack_10;
  uint32_t u_local;
  
  if (u < 0x80) {
    sStack_10 = 1;
  }
  else if (u < 0x800) {
    sStack_10 = 2;
  }
  else if (u < 0x10000) {
    sStack_10 = 3;
  }
  else {
    sStack_10 = 4;
  }
  return sStack_10;
}

Assistant:

size_t CBB_get_utf8_len(uint32_t u) {
  if (u <= 0x7f) {
    return 1;
  }
  if (u <= 0x7ff) {
    return 2;
  }
  if (u <= 0xffff) {
    return 3;
  }
  return 4;
}